

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O2

prf_node_t * prf_vertex_list_node_create(prf_model_t *model,int numvertices)

{
  prf_node_t *ppVar1;
  uint16_t datasize;
  
  datasize = (uint16_t)(numvertices << 2);
  ppVar1 = prf_node_create_etc(model,datasize);
  if (ppVar1 != (prf_node_t *)0x0) {
    ppVar1->opcode = 0x48;
    ppVar1->length = datasize + 4;
  }
  return ppVar1;
}

Assistant:

prf_node_t *
prf_vertex_list_node_create(
    prf_model_t * model,
    int numvertices )
{
    prf_node_t * node =
        prf_node_create_etc( model, (uint16_t) (numvertices * 4) );
    if ( node ) {
        node->opcode = 72;
        node->length = 4 + numvertices * 4;
    }
    return node;
}